

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string ** google::protobuf::internal::MakeDenseEnumCache_abi_cxx11_
                    (EnumDescriptor *desc,int min_val,int max_val)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong __n;
  string **__s;
  EnumValueDescriptor *pEVar4;
  string *psVar5;
  int local_30;
  int i_1;
  int num;
  int i;
  int count;
  string **str_ptrs;
  int max_val_local;
  int min_val_local;
  EnumDescriptor *desc_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((max_val - min_val) + 1);
  __n = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  __s = (string **)operator_new__(__n);
  memset(__s,0,__n);
  iVar2 = EnumDescriptor::value_count(desc);
  for (i_1 = 0; i_1 < iVar2; i_1 = i_1 + 1) {
    pEVar4 = EnumDescriptor::value(desc,i_1);
    iVar3 = EnumValueDescriptor::number(pEVar4);
    if (__s[iVar3 - min_val] == (string *)0x0) {
      pEVar4 = EnumDescriptor::value(desc,i_1);
      psVar5 = NameOfEnumAsString_abi_cxx11_(pEVar4);
      __s[iVar3 - min_val] = psVar5;
    }
  }
  for (local_30 = 0; local_30 < (max_val - min_val) + 1; local_30 = local_30 + 1) {
    if (__s[local_30] == (string *)0x0) {
      psVar5 = GetEmptyStringAlreadyInited_abi_cxx11_();
      __s[local_30] = psVar5;
    }
  }
  return __s;
}

Assistant:

const std::string** MakeDenseEnumCache(const EnumDescriptor* desc, int min_val,
                                       int max_val) {
  auto* str_ptrs =
      new const std::string*[static_cast<size_t>(max_val - min_val + 1)]();
  const int count = desc->value_count();
  for (int i = 0; i < count; ++i) {
    const int num = desc->value(i)->number();
    if (str_ptrs[num - min_val] == nullptr) {
      // Don't over-write an existing entry, because in case of duplication, the
      // first one wins.
      str_ptrs[num - min_val] = &internal::NameOfEnumAsString(desc->value(i));
    }
  }
  // Change any unfilled entries to point to the empty string.
  for (int i = 0; i < max_val - min_val + 1; ++i) {
    if (str_ptrs[i] == nullptr) str_ptrs[i] = &GetEmptyStringAlreadyInited();
  }
  return str_ptrs;
}